

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.h
# Opt level: O2

void helper::replace<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchIn,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchFor,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *replaceWith)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  while (lVar2 != -1) {
    uVar1 = std::__cxx11::string::find((string *)searchIn,(ulong)searchFor);
    lVar2 = -1;
    if (uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)searchIn,uVar1,(string *)searchFor->_M_string_length);
      lVar2 = uVar1 + replaceWith->_M_string_length;
    }
  }
  return;
}

Assistant:

void replace( T &searchIn, const T &searchFor, const T &replaceWith )
	{
		size_t pos = 0;
		while( pos != T::npos )
		{
			pos = searchIn.find( searchFor, pos );
			if( pos != T::npos )
			{
				searchIn.replace( pos, searchFor.size(), replaceWith );
				pos += replaceWith.size();
			}
		}
	}